

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

int boost::xpressive::detail::
    toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end,traits<char> *tr,int radix,int max)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar2 = begin->_M_current;
  iVar3 = 0;
  while( true ) {
    if (pcVar2 == end._M_current) {
      return iVar3;
    }
    iVar1 = (*tr->_vptr_traits[5])(tr,(ulong)(uint)(int)*pcVar2,(ulong)(uint)radix);
    if (iVar1 == -1) break;
    iVar3 = iVar3 * radix + iVar1;
    if (max < iVar3) {
      return iVar3 / radix;
    }
    pcVar2 = begin->_M_current + 1;
    begin->_M_current = pcVar2;
  }
  return iVar3;
}

Assistant:

int toi(InIter &begin, InIter end, Traits const &tr, int radix = 10, int max = INT_MAX)
{
    detail::ignore_unused(tr);
    int i = 0, c = 0;
    for(; begin != end && -1 != (c = tr.value(*begin, radix)); ++begin)
    {
        if(max < ((i *= radix) += c))
            return i / radix;
    }
    return i;
}